

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Builder * __thiscall
capnp::LocalCallContext::getResults
          (Builder *__return_storage_ptr__,LocalCallContext *this,
          Maybe<capnp::MessageSize> *sizeHint)

{
  ResponseHook *pRVar1;
  Disposer *pDVar2;
  CapTableBuilder *pCVar3;
  Disposer *pDVar4;
  ResponseHook *pRVar5;
  Own<capnp::LocalResponse,_std::nullptr_t> localResponse;
  Disposer *local_78;
  ResponseHook *local_70;
  Builder local_68;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  if ((this->response).ptr.isSet == false) {
    kj::heap<capnp::LocalResponse,kj::Maybe<capnp::MessageSize>&>((kj *)&local_78,sizeHint);
    MessageBuilder::getRootInternal(&local_68,(MessageBuilder *)(local_70 + 1));
    (this->responseBuilder).builder.pointer =
         (WirePointer *)CONCAT44(local_68.builder.pointer._4_4_,local_68.builder.pointer._0_4_);
    (this->responseBuilder).builder.segment =
         (SegmentBuilder *)CONCAT44(local_68.builder.segment._4_4_,local_68.builder.segment._0_4_);
    (this->responseBuilder).builder.capTable =
         (CapTableBuilder *)
         CONCAT44(local_68.builder.capTable._4_4_,local_68.builder.capTable._0_4_);
    capnp::_::PointerBuilder::asReader(&(this->responseBuilder).builder);
    pRVar5 = local_70;
    pDVar4 = local_78;
    local_70 = (ResponseHook *)0x0;
    local_68.builder.pointer._0_4_ = local_30;
    local_68.builder.pointer._4_4_ = uStack_2c;
    uStack_50 = uStack_28;
    uStack_4c = uStack_24;
    local_68.builder.segment._0_4_ = local_40;
    local_68.builder.segment._4_4_ = uStack_3c;
    local_68.builder.capTable._0_4_ = uStack_38;
    local_68.builder.capTable._4_4_ = uStack_34;
    if ((this->response).ptr.isSet == true) {
      (this->response).ptr.isSet = false;
      pRVar1 = (this->response).ptr.field_1.value.hook.ptr;
      if (pRVar1 != (ResponseHook *)0x0) {
        (this->response).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
        pDVar2 = (this->response).ptr.field_1.value.hook.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,pRVar1->_vptr_ResponseHook[-2] + (long)&pRVar1->_vptr_ResponseHook);
      }
    }
    pRVar1 = local_70;
    *(undefined4 *)((long)&(this->response).ptr.field_1 + 0x10) = local_68.builder.pointer._0_4_;
    *(undefined4 *)((long)&(this->response).ptr.field_1 + 0x14) = local_68.builder.pointer._4_4_;
    *(undefined4 *)((long)&(this->response).ptr.field_1 + 0x18) = uStack_50;
    *(undefined4 *)((long)&(this->response).ptr.field_1 + 0x1c) = uStack_4c;
    *(undefined4 *)&(this->response).ptr.field_1 = local_68.builder.segment._0_4_;
    *(undefined4 *)((long)&(this->response).ptr.field_1 + 4) = local_68.builder.segment._4_4_;
    *(undefined4 *)((long)&(this->response).ptr.field_1 + 8) = local_68.builder.capTable._0_4_;
    *(undefined4 *)((long)&(this->response).ptr.field_1 + 0xc) = local_68.builder.capTable._4_4_;
    (this->response).ptr.field_1.value.hook.disposer = pDVar4;
    (this->response).ptr.field_1.value.hook.ptr = pRVar5;
    (this->response).ptr.isSet = true;
    if (local_70 != (ResponseHook *)0x0) {
      local_70 = (ResponseHook *)0x0;
      (**local_78->_vptr_Disposer)(local_78,(long)pRVar1 + *(long *)(*(long *)pRVar1 + -0x10));
    }
  }
  (__return_storage_ptr__->builder).pointer = (this->responseBuilder).builder.pointer;
  pCVar3 = (this->responseBuilder).builder.capTable;
  (__return_storage_ptr__->builder).segment = (this->responseBuilder).builder.segment;
  (__return_storage_ptr__->builder).capTable = pCVar3;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
    if (response == kj::none) {
      auto localResponse = kj::heap<LocalResponse>(sizeHint);
      responseBuilder = localResponse->message.getRoot<AnyPointer>();
      response = Response<AnyPointer>(responseBuilder.asReader(), kj::mv(localResponse));
    }
    return responseBuilder;
  }